

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::icdf_
          (snedecor_f_dist<long_double> *this,result_type_conflict3 x)

{
  int iVar1;
  undefined4 extraout_var;
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  result_type_conflict3 t;
  undefined2 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  undefined2 uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd8;
  
  iVar1 = param_type::n(in_RDI);
  uVar2 = (undefined2)iVar1;
  param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
  math::inv_Beta_I((longdouble)
                   CONCAT28(in_stack_ffffffffffffffd8,
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
                   (longdouble)
                   CONCAT28(uVar2,CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                   (longdouble)CONCAT28(in_stack_ffffffffffffffb8,in_RDI));
  param_type::m(in_RDI,in_RSI,extraout_EDX_00,in_RCX,in_R8D,in_R9D);
  iVar1 = param_type::n(in_RDI);
  return (result_type_conflict3 *)CONCAT44(extraout_var,iVar1);
}

Assistant:

icdf_(result_type x) const {
      const result_type t{math::inv_Beta_I(x, result_type(1) / result_type(2) * P.n(),
                                           result_type(1) / result_type(2) * P.m())};
      return t / (1 - t) * static_cast<result_type>(P.m()) / static_cast<result_type>(P.n());
    }